

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

void __thiscall google::protobuf::internal::ArenaStringPtr::ClearToEmpty(ArenaStringPtr *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) != 0) {
    puVar2 = (undefined8 *)((ulong)pvVar1 & 0xfffffffffffffffc);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
  }
  return;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }